

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
 __thiscall
Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForRead
          (Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *this)

{
  long *plVar1;
  long in_RSI;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  do {
    plVar1 = *(long **)(in_RSI + 0xd0);
    if ((*(long *)(in_RSI + 0xe0) - (long)plVar1 >> 3) +
        (*(long *)(in_RSI + 0xf0) - *(long *)(in_RSI + 0xf8) >> 3) +
        ((((ulong)(*(long *)(in_RSI + 0x108) - *(long *)(in_RSI + 0xe8)) >> 3) - 1) +
        (ulong)(*(long *)(in_RSI + 0x108) == 0)) * 0x40 != 0) {
      (this->m_).super___mutex_base._M_mutex.__align = *plVar1;
      *plVar1 = 0;
      std::
      deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
      ::pop_front((deque<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>,_std::allocator<std::unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>_>_>
                   *)(in_RSI + 0xc0));
LAB_001461c0:
      std::unique_lock<std::mutex>::~unique_lock(&local_30);
      return (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
              )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
                )this;
    }
    if (*(char *)(in_RSI + 0x68) != '\0') {
      (this->m_).super___mutex_base._M_mutex.__align = 0;
      goto LAB_001461c0;
    }
    std::condition_variable::wait((unique_lock *)(in_RSI + 0x28));
  } while( true );
}

Assistant:

std::unique_ptr<T> popForRead() {
    std::unique_lock<std::mutex> lock(m_);
    while (read_.size() == 0 && !closed_) {
      cv_.wait(lock);
    }

    // Allow read side to drain
    if (read_.size() == 0 && closed_) {
      return std::unique_ptr<T>(nullptr);
    }

    auto v = std::move(read_.front());
    read_.pop_front();
    return v;
  }